

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O1

writer * argo::operator<<(writer *w,int i)

{
  ostringstream ss;
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::operator<<((ostream *)local_190,i);
  std::__cxx11::stringbuf::str();
  (*w->_vptr_writer[2])(w,local_1b0);
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0]);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return w;
}

Assistant:

writer &NAMESPACE::operator<<(writer& w, int i)
{
    ostringstream ss;
    ss << i;
    w.write(ss.str());
    return w;
}